

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

int32 __thiscall rw::MaterialList::findIndex(MaterialList *this,Material *mat)

{
  int local_24;
  int32 i;
  Material *mat_local;
  MaterialList *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->numMaterials <= local_24) {
      return -1;
    }
    if (this->materials[local_24] == mat) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int32
MaterialList::findIndex(Material *mat)
{
	for(int32 i = 0; i < this->numMaterials; i++)
		if(this->materials[i] == mat)
			return i;
	return -1;
}